

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat __thiscall Mat::Inverse(Mat *this)

{
  double dVar1;
  int m_00;
  int iVar2;
  double *pdVar3;
  double *extraout_RDX;
  Mat *in_RSI;
  Mat MVar4;
  Mat local_88;
  Mat local_78;
  Mat local_68;
  undefined1 local_58 [8];
  Mat yy;
  Mat xx;
  int m;
  int local_20;
  int n;
  int j;
  int i;
  Mat *this_local;
  Mat *ainv;
  
  m_00 = in_RSI->n_rows_;
  Mat(this,m_00,m_00);
  for (n = 0; n < m_00; n = n + 1) {
    for (local_20 = 0; local_20 < m_00; local_20 = local_20 + 1) {
      pdVar3 = operator()(this,n,local_20);
      *pdVar3 = 0.0;
    }
    pdVar3 = operator()(this,n,n);
    *pdVar3 = 1.0;
  }
  iVar2 = in_RSI->n_cols_;
  Mat((Mat *)&yy.v_,m_00);
  Mat((Mat *)local_58,m_00);
  for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
    for (n = 0; n < m_00; n = n + 1) {
      pdVar3 = operator()(this,n,local_20);
      dVar1 = *pdVar3;
      pdVar3 = operator()((Mat *)&yy.v_,n);
      *pdVar3 = dVar1;
      Mat(&local_88,(Mat *)&yy.v_);
      GaussLin(&local_78,in_RSI,(int)&local_88);
      operator=(&local_68,(Mat *)local_58);
      ~Mat(&local_68);
      ~Mat(&local_78);
      ~Mat(&local_88);
    }
    for (n = 0; n < m_00; n = n + 1) {
      pdVar3 = operator()((Mat *)local_58,n);
      dVar1 = *pdVar3;
      pdVar3 = operator()(this,n,local_20);
      *pdVar3 = dVar1;
    }
  }
  ~Mat((Mat *)local_58);
  ~Mat((Mat *)&yy.v_);
  MVar4.v_ = extraout_RDX;
  MVar4._0_8_ = this;
  return MVar4;
}

Assistant:

Mat Mat::Inverse() const
{
	int i,j;
	int n = n_rows_;
	Mat ainv(n,n);
	for (i=0; i<n; i++) {
		for (j=0; j<n; j++) ainv(i,j) = 0.;
		ainv(i,i) = 1.;
	}
	int m = n_cols_;	
	Mat xx(n), yy(n);
	for (j = 0; j < m; j++) {
		for (i=0; i<n; i++) {
			xx(i) = ainv(i,j);
			yy = GaussLin(xx,n);
		}
		for (i=0; i<n; i++)
			ainv(i,j) = yy(i);
	}
	return ainv;
}